

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt__v_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  uint uVar12;
  uchar buffer [8];
  byte local_50 [8];
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  ulong uVar13;
  
  local_50[0] = 0;
  local_50[1] = 0;
  local_50[2] = 0;
  local_50[3] = 0;
  local_50[4] = 0;
  local_50[5] = 0;
  local_50[6] = 0;
  local_50[7] = 0;
  if (0 < w) {
    local_48 = (ulong)(h - kernel_width);
    lVar6 = (long)stride_in_bytes;
    uVar12 = (h - kernel_width) + 1;
    uVar13 = (ulong)uVar12;
    local_34 = 0;
    local_3c = h;
    local_38 = w;
    do {
      memset(local_50,0,(ulong)kernel_width);
      uVar4 = uVar12;
      switch(kernel_width) {
      case 2:
        if ((int)local_48 < 0) {
LAB_00169945:
          uVar5 = 0;
          uVar4 = 0;
        }
        else {
          uVar8 = 0;
          uVar5 = 0;
          pbVar10 = pixels;
          do {
            bVar1 = *pbVar10;
            bVar2 = local_50[(uint)uVar8 & 7];
            local_50[(uint)uVar8 + 2 & 7] = bVar1;
            uVar3 = (int)uVar5 + ((uint)bVar1 - (uint)bVar2);
            uVar5 = (ulong)uVar3;
            *pbVar10 = (byte)(uVar3 >> 1);
            uVar8 = uVar8 + 1;
            pbVar10 = pbVar10 + lVar6;
          } while (uVar13 != uVar8);
        }
        break;
      case 3:
        if ((int)local_48 < 0) goto LAB_00169945;
        uVar8 = 0;
        uVar5 = 0;
        pbVar10 = pixels;
        do {
          bVar1 = *pbVar10;
          bVar2 = local_50[(uint)uVar8 & 7];
          local_50[(uint)uVar8 + 3 & 7] = bVar1;
          uVar5 = (ulong)((int)uVar5 + ((uint)bVar1 - (uint)bVar2));
          *pbVar10 = (byte)(uVar5 / 3);
          uVar8 = uVar8 + 1;
          pbVar10 = pbVar10 + lVar6;
        } while (uVar13 != uVar8);
        break;
      case 4:
        if ((int)local_48 < 0) goto LAB_00169945;
        uVar8 = 0;
        uVar5 = 0;
        pbVar10 = pixels;
        do {
          bVar1 = *pbVar10;
          uVar9 = (ulong)((uint)uVar8 & 7);
          local_50[uVar9 ^ 4] = bVar1;
          uVar3 = (int)uVar5 + ((uint)bVar1 - (uint)local_50[uVar9]);
          uVar5 = (ulong)uVar3;
          *pbVar10 = (byte)(uVar3 >> 2);
          uVar8 = uVar8 + 1;
          pbVar10 = pbVar10 + lVar6;
        } while (uVar13 != uVar8);
        break;
      case 5:
        if ((int)local_48 < 0) goto LAB_00169945;
        uVar8 = 0;
        uVar5 = 0;
        pbVar10 = pixels;
        do {
          bVar1 = *pbVar10;
          bVar2 = local_50[(uint)uVar8 & 7];
          local_50[(uint)uVar8 + 5 & 7] = bVar1;
          uVar5 = (ulong)((int)uVar5 + ((uint)bVar1 - (uint)bVar2));
          *pbVar10 = (byte)(uVar5 / 5);
          uVar8 = uVar8 + 1;
          pbVar10 = pbVar10 + lVar6;
        } while (uVar13 != uVar8);
        break;
      default:
        if ((int)local_48 < 0) {
          uVar5 = 0;
          uVar4 = 0;
        }
        else {
          uVar8 = 0;
          uVar5 = 0;
          pbVar10 = pixels;
          do {
            bVar1 = *pbVar10;
            bVar2 = local_50[(uint)uVar8 & 7];
            local_50[kernel_width + (uint)uVar8 & 7] = bVar1;
            uVar3 = (int)uVar5 + ((uint)bVar1 - (uint)bVar2);
            uVar5 = (ulong)uVar3;
            *pbVar10 = (byte)(uVar3 / kernel_width);
            uVar8 = uVar8 + 1;
            pbVar10 = pbVar10 + lVar6;
          } while (uVar13 != uVar8);
        }
      }
      iVar7 = local_3c - uVar4;
      if (iVar7 != 0 && (int)uVar4 <= local_3c) {
        lVar11 = (long)(int)uVar4;
        pbVar10 = pixels + lVar6 * lVar11;
        do {
          if (*pbVar10 != 0) {
            __assert_fail("pixels[i*stride_in_bytes] == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_truetype.h"
                          ,0x1020,
                          "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
          }
          uVar4 = (int)uVar5 - (uint)local_50[(uint)lVar11 & 7];
          uVar5 = (ulong)uVar4;
          *pbVar10 = (byte)(uVar4 / kernel_width);
          lVar11 = lVar11 + 1;
          pbVar10 = pbVar10 + lVar6;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      pixels = pixels + 1;
      local_34 = local_34 + 1;
    } while (local_34 != local_38);
  }
  return;
}

Assistant:

static void stbtt__v_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
   unsigned char buffer[STBTT_MAX_OVERSAMPLE];
   int safe_h = h - kernel_width;
   int j;
   STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); // suppress bogus warning from VS2013 -analyze
   for (j=0; j < w; ++j) {
      int i;
      unsigned int total;
      STBTT_memset(buffer, 0, kernel_width);

      total = 0;

      // make kernel_width a constant in common cases so compiler can optimize out the divide
      switch (kernel_width) {
         case 2:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 2);
            }
            break;
         case 3:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 3);
            }
            break;
         case 4:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 4);
            }
            break;
         case 5:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / 5);
            }
            break;
         default:
            for (i=0; i <= safe_h; ++i) {
               total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
               buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
               pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
            }
            break;
      }

      for (; i < h; ++i) {
         STBTT_assert(pixels[i*stride_in_bytes] == 0);
         total -= buffer[i & STBTT__OVER_MASK];
         pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
      }

      pixels += 1;
   }
}